

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

FileFlags __thiscall QResourceFileEngine::fileFlags(QResourceFileEngine *this,FileFlags type)

{
  bool bVar1;
  QFlagsStorage<QAbstractFileEngine::FileFlag> QVar2;
  FileError *this_00;
  long in_FS_OFFSET;
  QLatin1StringView local_50;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_QAbstractFileEngine).d_ptr.d[1].fileError;
  bVar1 = QResource::isValid((QResource *)this_00);
  QVar2.i = 0;
  if (bVar1) {
    QVar2.i = 0x4444;
    if ((short)type.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
               super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i == 0) {
      QVar2.i = 0;
    }
    if (((uint)type.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
               super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i & 0xf0000) != 0) {
      bVar1 = QResource::isDir((QResource *)this_00);
      if (bVar1) {
        QVar2.i = QVar2.i | 0x40000;
      }
      else {
        QVar2.i = QVar2.i | 0x20000;
      }
    }
    if (((uint)type.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
               super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i & 0xff00000) != 0) {
      QResource::absoluteFilePath((QString *)&local_40,(QResource *)this_00);
      local_50.m_size = 2;
      local_50.m_data = ":/";
      bVar1 = ::operator==((QString *)&local_40,&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      QVar2.i = QVar2.i + (uint)bVar1 * 0x800000 + 0x400000;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>)
           (QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>)QVar2.i;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractFileEngine::FileFlags QResourceFileEngine::fileFlags(QAbstractFileEngine::FileFlags type) const
{
    Q_D(const QResourceFileEngine);
    QAbstractFileEngine::FileFlags ret;
    if (!d->resource.isValid())
        return ret;

    if (type & PermsMask)
        ret |= QAbstractFileEngine::FileFlags(ReadOwnerPerm | ReadUserPerm | ReadGroupPerm
                                              | ReadOtherPerm);
    if (type & TypesMask) {
        if (d->resource.isDir())
            ret |= DirectoryType;
        else
            ret |= FileType;
    }
    if (type & FlagsMask) {
        ret |= ExistsFlag;
        if (d->resource.absoluteFilePath() == ":/"_L1)
            ret |= RootFlag;
    }
    return ret;
}